

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O0

EventObject * chatra::derefAsEventObject(Reference ref)

{
  bool bVar1;
  ReferenceValueType RVar2;
  ObjectBase *this;
  Class *pCVar3;
  Class *pCVar4;
  Async *pAVar5;
  RuntimeException *pRVar6;
  EventObject *local_38;
  EventObject *local_20;
  EventObject *ret;
  Class *cl;
  Reference ref_local;
  
  cl = (Class *)ref.node;
  RVar2 = Reference::valueType((Reference *)&cl);
  if (RVar2 == Object) {
    bVar1 = Reference::isNull((Reference *)&cl);
    if (!bVar1) {
      this = Reference::deref<chatra::ObjectBase>((Reference *)&cl);
      pCVar3 = ObjectBase::getClass(this);
      local_20 = (EventObject *)0x0;
      pCVar4 = Async::getClassStatic();
      if (pCVar3 == pCVar4) {
        pAVar5 = Reference::deref<chatra::Async>((Reference *)&cl);
        local_38 = (EventObject *)0x0;
        if (pAVar5 != (Async *)0x0) {
          local_38 = &pAVar5->super_EventObject;
        }
        local_20 = local_38;
      }
      if (local_20 != (EventObject *)0x0) {
        return local_20;
      }
      pRVar6 = (RuntimeException *)__cxa_allocate_exception(0x10);
      RuntimeException::RuntimeException(pRVar6,IllegalArgumentException);
      __cxa_throw(pRVar6,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
  }
  pRVar6 = (RuntimeException *)__cxa_allocate_exception(0x10);
  RuntimeException::RuntimeException(pRVar6,IllegalArgumentException);
  __cxa_throw(pRVar6,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

EventObject* derefAsEventObject(Reference ref) {
	if (ref.valueType() != ReferenceValueType::Object || ref.isNull())
		throw RuntimeException(StringId::IllegalArgumentException);

	auto* cl = ref.deref<ObjectBase>().getClass();
	EventObject* ret = nullptr;
	if (cl == Async::getClassStatic())
		ret = &ref.deref<Async>();

	if (ret != nullptr)
		return ret;

	throw RuntimeException(StringId::IllegalArgumentException);
}